

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeRegExp::ParseNodeRegExp
          (ParseNodeRegExp *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  OpCode nop_local;
  ParseNodeRegExp *this_local;
  
  ParseNode::ParseNode(&this->super_ParseNode,nop,ichMin,ichLim);
  this->regexPattern = (RegexPattern *)0x0;
  this->regexPatternIndex = 0;
  return;
}

Assistant:

ParseNodeRegExp::ParseNodeRegExp(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNode(nop, ichMin, ichLim)
{
    this->regexPattern = nullptr;
    this->regexPatternIndex = 0;
}